

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcopy.c
# Opt level: O3

void dcopy_(integer *n,doublereal *dx,integer *incx,doublereal *dy,integer *incy)

{
  int iVar1;
  uint uVar2;
  doublereal *pdVar3;
  doublereal *pdVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  
  uVar2 = *n;
  if (0 < (int)uVar2) {
    iVar1 = *incx;
    if ((long)iVar1 == 1) {
      iVar7 = *incy;
      if (iVar7 == 1) {
        if (uVar2 % 7 == 0) {
          uVar5 = 1;
        }
        else {
          uVar8 = 0;
          do {
            dy[uVar8] = dx[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar2 % 7 != uVar8);
          if ((int)uVar2 < 7) {
            return;
          }
          uVar5 = uVar2 % 7 + 1;
        }
        uVar8 = (ulong)uVar5;
        do {
          dy[uVar8 - 1] = dx[uVar8 - 1];
          dy[uVar8] = dx[uVar8];
          dy[uVar8 + 1] = dx[uVar8 + 1];
          dy[uVar8 + 2] = dx[uVar8 + 2];
          dy[uVar8 + 3] = dx[uVar8 + 3];
          dy[uVar8 + 4] = dx[uVar8 + 4];
          dy[uVar8 + 5] = dx[uVar8 + 5];
          uVar8 = uVar8 + 7;
        } while (uVar8 <= uVar2);
        return;
      }
      iVar6 = 1 - uVar2;
      lVar9 = 1;
    }
    else {
      iVar6 = 1 - uVar2;
      iVar10 = iVar1 * iVar6 + 1;
      if (-1 < iVar1) {
        iVar10 = 1;
      }
      iVar7 = *incy;
      lVar9 = (long)iVar10;
    }
    iVar10 = 1;
    if (iVar7 < 0) {
      iVar10 = iVar6 * iVar7 + 1;
    }
    pdVar4 = dx + lVar9 + -1;
    pdVar3 = dy + (long)iVar10 + -1;
    do {
      *pdVar3 = *pdVar4;
      pdVar4 = pdVar4 + iVar1;
      pdVar3 = pdVar3 + iVar7;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void dcopy_(integer *n, doublereal *dx, integer *incx, 
	doublereal *dy, integer *incy)
{


    /* System generated locals */

    /* Local variables */
    integer i, m, ix, iy, mp1;


/*     copies a vector, x, to a vector, y.   
       uses unrolled loops for increments equal to one.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DY(I) dy[(I)-1]
#define DX(I) dx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	DY(iy) = DX(ix);
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1   


          clean-up loop */

L20:
    m = *n % 7;
    if (m == 0) {
	goto L40;
    }
    for (i = 1; i <= m; ++i) {
	DY(i) = DX(i);
/* L30: */
    }
    if (*n < 7) {
	return;
    }
L40:
    mp1 = m + 1;
    for (i = mp1; i <= *n; i += 7) {
	DY(i) = DX(i);
	DY(i + 1) = DX(i + 1);
	DY(i + 2) = DX(i + 2);
	DY(i + 3) = DX(i + 3);
	DY(i + 4) = DX(i + 4);
	DY(i + 5) = DX(i + 5);
	DY(i + 6) = DX(i + 6);
/* L50: */
    }
    return;
}